

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_SetInitValue(Abc_Obj_t *pObj,int val,int dc)

{
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
  if (dc != 0) {
    return;
  }
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | (ushort)(val != 0) * 0x20 + 0x20;
  return;
}

Assistant:

static inline void Abc_FlowRetime_SetInitValue( Abc_Obj_t * pObj,
                                                int val, int dc ) {
  
  // store init value
  FUNSET(pObj, INIT_CARE);
  if (!dc){
    if (val) {
      FSET(pObj, INIT_1);
    } else {
      FSET(pObj, INIT_0);
    }
  }
}